

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QSize __thiscall QWidgetPrivate::adjustedSize(QWidgetPrivate *this)

{
  bool bVar1;
  uint uVar2;
  Int IVar3;
  int iVar4;
  QWidget *this_00;
  QTLWExtra *pQVar5;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QTLWExtra *extra;
  QScreen *screenAtPoint;
  QWidget *q;
  QRect r;
  QRect screen;
  Orientations exp;
  QSize s;
  QRect *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QWidget *in_stack_ffffffffffffff18;
  QLayout *in_stack_ffffffffffffff20;
  QWidget *in_stack_ffffffffffffff38;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  undefined1 local_74 [16];
  undefined1 local_64 [16];
  QPoint local_54;
  undefined1 local_4c [16];
  int local_3c;
  int local_38;
  QFlagsStorageHelper<Qt::Orientation,_4> local_34;
  int local_30;
  int local_2c;
  QFlagsStorageHelper<Qt::Orientation,_4> local_28;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_24;
  QFlagsStorageHelper<Qt::Orientation,_4> local_20;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_1c;
  Int local_18;
  Int local_14;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QSize)(**(code **)(*(long *)this_00 + 0x70))();
  bVar1 = QWidget::isWindow((QWidget *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                           );
  if (bVar1) {
    local_14 = 0xaaaaaaaa;
    QFlags<Qt::Orientation>::QFlags((QFlags<Qt::Orientation> *)0x377594);
    iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (in_RDI->layout == (QLayout *)0x0) {
      local_1c.bits =
           (Bits)QWidget::sizePolicy((QWidget *)
                                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      bVar1 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_1c.bits);
      if (bVar1) {
        iVar4 = QSize::width((QSize *)0x37766a);
        (**(code **)(*(long *)this_00 + 0x80))(this_00,iVar4);
        QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
        in_stack_ffffffffffffff18 = this_00;
      }
      local_24.bits =
           (Bits)QWidget::sizePolicy((QWidget *)
                                     CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      local_20.super_QFlagsStorage<Qt::Orientation>.i =
           (QFlagsStorage<Qt::Orientation>)
           QSizePolicy::expandingDirections((QSizePolicy *)in_stack_ffffffffffffff18);
      local_14 = (Int)local_20.super_QFlagsStorage<Qt::Orientation>.i;
    }
    else {
      uVar2 = (*(in_RDI->layout->super_QLayoutItem)._vptr_QLayoutItem[9])
                        (&in_RDI->layout->super_QLayoutItem);
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffff20 = in_RDI->layout;
        QSize::width((QSize *)0x3775e5);
        QLayout::totalHeightForWidth((QLayout *)this_00,iVar4);
        QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
      }
      local_18 = (**(code **)(*(long *)in_RDI->layout + 0x88))();
      local_14 = local_18;
    }
    local_28.super_QFlagsStorage<Qt::Orientation>.i =
         (QFlagsStorage<Qt::Orientation>)
         QFlags<Qt::Orientation>::operator&
                   ((QFlags<Qt::Orientation> *)
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (Orientation)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_28);
    if (IVar3 != 0) {
      local_2c = QSize::width((QSize *)0x3776f4);
      local_30 = 200;
      qMax<int>(&local_2c,&local_30);
      QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    local_34.super_QFlagsStorage<Qt::Orientation>.i =
         (QFlagsStorage<Qt::Orientation>)
         QFlags<Qt::Orientation>::operator&
                   ((QFlags<Qt::Orientation> *)
                    CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (Orientation)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
    if (IVar3 != 0) {
      local_38 = QSize::height((QSize *)0x377762);
      local_3c = 100;
      qMax<int>(&local_38,&local_3c);
      QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    }
    local_4c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_4c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_54 = QWidget::pos(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = (QWidget *)QGuiApplication::screenAt((QPoint *)&local_54);
    if (in_stack_ffffffffffffff38 == (QWidget *)0x0) {
      QGuiApplication::primaryScreen();
      local_74 = QScreen::geometry();
      local_4c = local_74;
    }
    else {
      local_64 = QScreen::geometry();
      local_4c = local_64;
    }
    local_78 = QSize::width((QSize *)0x377875);
    iVar4 = QRect::width(in_stack_ffffffffffffff08);
    local_7c = (iVar4 << 1) / 3;
    qMin<int>(&local_78,&local_7c);
    QSize::setWidth((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                    (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    local_80 = QSize::height((QSize *)0x3778c5);
    iVar4 = QRect::height(in_stack_ffffffffffffff08);
    local_84 = (iVar4 << 1) / 3;
    qMin<int>(&local_80,&local_84);
    QSize::setHeight((QSize *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    pQVar5 = maybeTopData((QWidgetPrivate *)
                          CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (pQVar5 != (QTLWExtra *)0x0) {
      *(ushort *)&pQVar5->field_0xe0 = *(ushort *)&pQVar5->field_0xe0 & 0xfdff | 0x200;
    }
  }
  bVar1 = QSize::isValid((QSize *)in_stack_ffffffffffffff20);
  if (!bVar1) {
    QWidget::childrenRect(in_stack_ffffffffffffff38);
    bVar1 = QRect::isNull((QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    if (!bVar1) {
      QRect::size((QRect *)in_stack_ffffffffffffff20);
      iVar4 = QRect::x((QRect *)0x3779a4);
      iVar4 = iVar4 << 1;
      QRect::y((QRect *)0x3779b4);
      QSize::QSize((QSize *)CONCAT44(iVar4,in_stack_ffffffffffffff10),
                   (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08);
      local_10 = ::operator+((QSize *)in_stack_ffffffffffffff20,(QSize *)in_stack_ffffffffffffff18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QSize QWidgetPrivate::adjustedSize() const
{
    Q_Q(const QWidget);

    QSize s = q->sizeHint();

    if (q->isWindow()) {
        Qt::Orientations exp;
        if (layout) {
            if (layout->hasHeightForWidth())
                s.setHeight(layout->totalHeightForWidth(s.width()));
            exp = layout->expandingDirections();
        } else
        {
            if (q->sizePolicy().hasHeightForWidth())
                s.setHeight(q->heightForWidth(s.width()));
            exp = q->sizePolicy().expandingDirections();
        }
        if (exp & Qt::Horizontal)
            s.setWidth(qMax(s.width(), 200));
        if (exp & Qt::Vertical)
            s.setHeight(qMax(s.height(), 100));

        QRect screen;
        if (const QScreen *screenAtPoint = QGuiApplication::screenAt(q->pos()))
            screen = screenAtPoint->geometry();
        else
            screen = QGuiApplication::primaryScreen()->geometry();

        s.setWidth(qMin(s.width(), screen.width()*2/3));
        s.setHeight(qMin(s.height(), screen.height()*2/3));

        if (QTLWExtra *extra = maybeTopData())
            extra->sizeAdjusted = true;
    }

    if (!s.isValid()) {
        QRect r = q->childrenRect(); // get children rectangle
        if (r.isNull())
            return s;
        s = r.size() + QSize(2 * r.x(), 2 * r.y());
    }

    return s;
}